

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  djg_clock *pdVar3;
  exception *this;
  int local_10;
  int i;
  bool v;
  
  for (local_10 = 0; local_10 < 1; local_10 = local_10 + 1) {
    if (g_gl.clocks[local_10] != (djg_clock *)0x0) {
      djgc_release(g_gl.clocks[local_10]);
    }
    pdVar3 = djgc_create();
    g_gl.clocks[local_10] = pdVar3;
  }
  bVar1 = loadTextures();
  if (bVar1) {
    bVar2 = loadBuffers();
    bVar1 = bVar1 && bVar2;
  }
  if (bVar1 != false) {
    bVar2 = loadFramebuffers();
    bVar1 = (bVar1 & bVar2) != 0;
  }
  if (bVar1 != false) {
    bVar2 = loadVertexArrays();
    bVar1 = (bVar1 & bVar2) != 0;
  }
  if (bVar1 != false) {
    bVar2 = loadPrograms();
    bVar1 = (bVar1 & bVar2) != 0;
  }
  if (bVar1 != false) {
    return (uint)bVar1;
  }
  this = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this);
  __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void init()
{
    bool v = true;
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i) {
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
        g_gl.clocks[i] = djgc_create();
    }

    if (v) v&= loadTextures();
    if (v) v&= loadBuffers();
    if (v) v&= loadFramebuffers();
    if (v) v&= loadVertexArrays();
    if (v) v&= loadPrograms();

    if (!v) throw std::exception();
}